

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O2

CMyString * SubString(CMyString *__return_storage_ptr__,CMyString *CS,int pos,int len)

{
  CMyString *CS_00;
  int iVar1;
  
  CS_00 = (CMyString *)malloc(0x408);
  InitCMyString(CS_00," ");
  iVar1 = CS->length - pos;
  if (len + pos <= CS->length) {
    iVar1 = len;
  }
  memcpy(CS_00->str,CS->str + pos,(long)iVar1);
  CS_00->length = iVar1;
  CS_00->str[iVar1] = '\0';
  memcpy(__return_storage_ptr__,CS_00,0x408);
  return __return_storage_ptr__;
}

Assistant:

CMyString SubString(CMyString *CS,const int pos,const int len)  //提取一个从pos位置起长度为len的子串
{
    int rlen = len;
    CMyString *tmpStr = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(tmpStr,(char *)" ");
    if(pos+len > CS->length)
        rlen = CS->length-pos;
    memcpy(tmpStr->str,CS->str+pos,rlen);
    tmpStr->length = rlen;
    tmpStr->str[tmpStr->length] = 0;
    return *tmpStr;
}